

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache.h
# Opt level: O2

bool __thiscall
CuckooCache::cache<uint256,_SignatureCacheHasher>::contains
          (cache<uint256,_SignatureCacheHasher> *this,uint256 *e,bool erase)

{
  __atomic_base<unsigned_char> *p_Var1;
  uint uVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  long in_FS_OFFSET;
  array<unsigned_int,_8UL> locs;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  compute_hashes(&locs,this,e);
  lVar4 = 0;
  do {
    lVar6 = lVar4;
    if (lVar6 == 0x20) goto LAB_0037e382;
    uVar2 = *(uint *)((long)locs._M_elems + lVar6);
    bVar5 = ::operator==(&(this->table).super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar2].super_base_blob<256U>,
                         &e->super_base_blob<256U>);
    lVar4 = lVar6 + 4;
  } while (!bVar5);
  if (erase) {
    LOCK();
    p_Var1 = &(this->collection_flags).mem._M_t.
              super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
              .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl[uVar2 >> 3].
              super___atomic_base<unsigned_char>;
    p_Var1->_M_i = p_Var1->_M_i | (byte)(1 << ((byte)uVar2 & 7));
    UNLOCK();
  }
LAB_0037e382:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return lVar6 != 0x20;
  }
  __stack_chk_fail();
}

Assistant:

inline bool contains(const Element& e, const bool erase) const
    {
        std::array<uint32_t, 8> locs = compute_hashes(e);
        for (const uint32_t loc : locs)
            if (table[loc] == e) {
                if (erase)
                    allow_erase(loc);
                return true;
            }
        return false;
    }